

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::AddAddressKnown
          (PeerManagerImpl *this,Peer *peer,CAddress *addr)

{
  bool bVar1;
  pointer this_00;
  CService *in_RDX;
  long in_FS_OFFSET;
  Span<const_unsigned_char> in_stack_00000010;
  unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>
  *in_stack_ffffffffffffff88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  CRollingBloomFilter *this_01;
  
  this_01 = *(CRollingBloomFilter **)(in_FS_OFFSET + 0x28);
  bVar1 = std::unique_ptr::operator_cast_to_bool(in_stack_ffffffffffffff88);
  if (!bVar1) {
    __assert_fail("peer.m_addr_known",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x4d0,
                  "void (anonymous namespace)::PeerManagerImpl::AddAddressKnown(Peer &, const CAddress &)"
                 );
  }
  this_00 = std::unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>::
            operator->(in_stack_ffffffffffffff88);
  CService::GetKey(in_RDX);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)this_00,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  CRollingBloomFilter::insert(this_01,in_stack_00000010);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  if (*(CRollingBloomFilter **)(in_FS_OFFSET + 0x28) == this_01) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::AddAddressKnown(Peer& peer, const CAddress& addr)
{
    assert(peer.m_addr_known);
    peer.m_addr_known->insert(addr.GetKey());
}